

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexOrdering.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderVertexOrdering::verifyVertexOrderingDoesNotChangeGeneratedPoints
          (TessellationShaderVertexOrdering *this,_test_iteration *test_iteration_a,
          _test_iteration *test_iteration_b)

{
  uint *puVar1;
  ostringstream *poVar2;
  ostringstream *this_00;
  char *pcVar3;
  MessageBuilder *this_01;
  TestError *this_02;
  _tessellation_shader_vertex_ordering vertex_ordering_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  string primitive_mode;
  string vertex_ordering;
  char *local_1e8;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  if ((ulong)test_iteration_a->n_vertices == 0) {
    return;
  }
  puVar1 = &test_iteration_b->n_vertices;
  if ((ulong)*puVar1 == 0) {
LAB_00cbd3e1:
    TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
              (&local_1e0,(TessellationShaderUtils *)(ulong)test_iteration_a->primitive_mode,
               (_tessellation_primitive_mode)test_iteration_b);
    TessellationShaderUtils::getESTokenForVertexOrderingMode_abi_cxx11_
              (&local_1c0,(TessellationShaderUtils *)(ulong)test_iteration_a->vertex_ordering,
               vertex_ordering_00);
    local_1a0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"For primitive mode: [",0x15);
    local_1e8 = local_1e0._M_dataplus._M_p;
    this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a0,&local_1e8);
    poVar2 = &this_01->m_str;
    std::__ostream_insert<char,std::char_traits<char>>
              (&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,
               "] and inner tessellation levels: [",0x22);
    std::ostream::_M_insert<double>((double)test_iteration_a->inner_tess_levels[0]);
    std::__ostream_insert<char,std::char_traits<char>>
              (&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
    std::ostream::_M_insert<double>((double)test_iteration_a->inner_tess_levels[1]);
    std::__ostream_insert<char,std::char_traits<char>>
              (&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,
               "] and outer tessellation levels: [",0x22);
    std::ostream::_M_insert<double>((double)test_iteration_a->outer_tess_levels[0]);
    std::__ostream_insert<char,std::char_traits<char>>
              (&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
    std::ostream::_M_insert<double>((double)test_iteration_a->outer_tess_levels[1]);
    std::__ostream_insert<char,std::char_traits<char>>
              (&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
    std::ostream::_M_insert<double>((double)test_iteration_a->outer_tess_levels[2]);
    std::__ostream_insert<char,std::char_traits<char>>
              (&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
    std::ostream::_M_insert<double>((double)test_iteration_a->outer_tess_levels[3]);
    std::__ostream_insert<char,std::char_traits<char>>
              (&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (&poVar2->super_basic_ostream<char,_std::char_traits<char>_>,
               ", vertices generated for CW and CCW orientations do not match.",0x3e);
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_128);
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,
               "For runs in which only vertex ordering setting differs, vertex from one run was not found in the other run."
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexOrdering.cpp"
               ,0x2db);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pcVar3 = test_iteration_a->data;
  test_iteration_b = (_test_iteration *)test_iteration_b->data;
  uVar4 = 0;
LAB_00cbd35d:
  uVar5 = (ulong)(uint)((int)uVar4 * 3);
  uVar6 = 0;
  do {
    uVar7 = uVar6 & 0xffffffff;
    fVar8 = *(float *)(pcVar3 + uVar5 * 4) - test_iteration_b->inner_tess_levels[uVar7 - 2];
    fVar9 = -fVar8;
    if (-fVar8 <= fVar8) {
      fVar9 = fVar8;
    }
    if (fVar9 < 1e-05) {
      fVar8 = *(float *)(pcVar3 + uVar5 * 4 + 4) - test_iteration_b->inner_tess_levels[uVar7 - 1];
      fVar9 = -fVar8;
      if (-fVar8 <= fVar8) {
        fVar9 = fVar8;
      }
      if (fVar9 < 1e-05) {
        fVar8 = *(float *)(pcVar3 + uVar5 * 4 + 8) - test_iteration_b->inner_tess_levels[uVar7];
        fVar9 = -fVar8;
        if (-fVar8 <= fVar8) {
          fVar9 = fVar8;
        }
        if (fVar9 < 1e-05) break;
      }
    }
    uVar6 = uVar6 + 3;
    if ((ulong)*puVar1 * 3 == uVar6) goto LAB_00cbd3e1;
  } while( true );
  uVar4 = uVar4 + 1;
  if (uVar4 == test_iteration_a->n_vertices) {
    return;
  }
  goto LAB_00cbd35d;
}

Assistant:

void TessellationShaderVertexOrdering::verifyVertexOrderingDoesNotChangeGeneratedPoints(
	const _test_iteration& test_iteration_a, const _test_iteration& test_iteration_b)
{
	const float epsilon = 1e-5f;

	/* Sanity checks */
	DE_ASSERT(test_iteration_a.is_point_mode_enabled);
	DE_ASSERT(test_iteration_b.is_point_mode_enabled);
	DE_ASSERT(test_iteration_a.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_CCW ||
			  test_iteration_a.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT);
	DE_ASSERT(test_iteration_b.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_CW);

	/* Iterate through all points in test set A and make sure they can be found in test set B */
	for (unsigned int n_vertex_a = 0; n_vertex_a < test_iteration_a.n_vertices; ++n_vertex_a)
	{
		bool		 has_been_found = false;
		const float* vertex_a_data  = (const float*)test_iteration_a.data + n_vertex_a * 3 /* components */;

		for (unsigned int n_vertex_b = 0; n_vertex_b < test_iteration_b.n_vertices; ++n_vertex_b)
		{
			const float* vertex_b_data = (const float*)test_iteration_b.data + n_vertex_b * 3 /* components */;

			if (de::abs(vertex_a_data[0] - vertex_b_data[0]) < epsilon &&
				de::abs(vertex_a_data[1] - vertex_b_data[1]) < epsilon &&
				de::abs(vertex_a_data[2] - vertex_b_data[2]) < epsilon)
			{
				has_been_found = true;

				break;
			}
		} /* for (all B set vertices) */

		if (!has_been_found)
		{
			std::string primitive_mode =
				TessellationShaderUtils::getESTokenForPrimitiveMode(test_iteration_a.primitive_mode);
			std::string vertex_ordering =
				TessellationShaderUtils::getESTokenForVertexOrderingMode(test_iteration_a.vertex_ordering);

			m_testCtx.getLog() << tcu::TestLog::Message << "For primitive mode: [" << primitive_mode.c_str()
							   << "] "
								  "and inner tessellation levels:"
								  " ["
							   << test_iteration_a.inner_tess_levels[0] << ", " << test_iteration_a.inner_tess_levels[1]
							   << "] "
								  "and outer tessellation levels:"
								  " ["
							   << test_iteration_a.outer_tess_levels[0] << ", " << test_iteration_a.outer_tess_levels[1]
							   << ", " << test_iteration_a.outer_tess_levels[2] << ", "
							   << test_iteration_a.outer_tess_levels[3] << "] "
							   << ", vertices generated for CW and CCW orientations do not match."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("For runs in which only vertex ordering setting differs, vertex from one run was not found in the "
					 "other run.");
		}
	} /* for (all A set vertices) */
}